

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx2::SphereMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  byte bVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint uVar27;
  uint uVar28;
  Scene *pSVar29;
  ulong uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [36];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [28];
  undefined1 auVar59 [64];
  undefined1 auVar60 [28];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [28];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  int local_2ec;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b4;
  float local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a4;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  undefined1 local_280 [32];
  Scene *local_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar51 [64];
  undefined1 auVar54 [64];
  undefined1 auVar58 [32];
  undefined1 auVar61 [32];
  
  pSVar29 = context->scene;
  local_80[0] = sphere->sharedGeomID;
  pGVar8 = (pSVar29->geometries).items[local_80[0]].ptr;
  lVar9 = *(long *)&pGVar8->field_0x58;
  _Var10 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[4] * _Var10);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[0] * _Var10);
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[5] * _Var10);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[1] * _Var10);
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[6] * _Var10);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[2] * _Var10);
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[7] * _Var10);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar9 + (sphere->primIDs).field_0.i[3] * _Var10);
  auVar53 = vunpcklps_avx(auVar38,auVar39);
  auVar34 = vunpckhps_avx(auVar38,auVar39);
  auVar41 = vunpcklps_avx(auVar36,auVar42);
  auVar38 = vunpckhps_avx(auVar36,auVar42);
  auVar21 = vunpcklps_avx(auVar53,auVar41);
  auVar53 = vunpckhps_avx(auVar53,auVar41);
  auVar41 = vunpcklps_avx(auVar34,auVar38);
  auVar36 = vunpckhps_avx(auVar34,auVar38);
  bVar7 = sphere->numPrimitives;
  auVar31._1_3_ = 0;
  auVar31[0] = bVar7;
  auVar31[4] = bVar7;
  auVar31._5_3_ = 0;
  auVar31[8] = bVar7;
  auVar31._9_3_ = 0;
  auVar31[0xc] = bVar7;
  auVar31._13_3_ = 0;
  auVar31[0x10] = bVar7;
  auVar31._17_3_ = 0;
  auVar31[0x14] = bVar7;
  auVar31._21_3_ = 0;
  auVar31[0x18] = bVar7;
  auVar31._25_3_ = 0;
  auVar31[0x1c] = bVar7;
  auVar31._29_3_ = 0;
  auVar31 = vpcmpgtd_avx2(auVar31,_DAT_0205a920);
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  aVar6 = (ray->super_RayK<1>).dir.field_0;
  auVar68 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar20 = vrcpss_avx(auVar68,auVar68);
  auVar68 = vfnmadd213ss_fma(auVar68,auVar20,ZEXT416(0x40000000));
  fVar18 = auVar20._0_4_ * auVar68._0_4_;
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  auVar34 = vsubps_avx(auVar21,auVar49);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar52._4_4_ = uVar2;
  auVar52._0_4_ = uVar2;
  auVar52._8_4_ = uVar2;
  auVar52._12_4_ = uVar2;
  auVar52._16_4_ = uVar2;
  auVar52._20_4_ = uVar2;
  auVar52._24_4_ = uVar2;
  auVar52._28_4_ = uVar2;
  auVar38 = vsubps_avx(auVar53,auVar43);
  auVar53 = vsubps_avx(auVar41,auVar52);
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar58._4_4_ = fVar3;
  auVar58._0_4_ = fVar3;
  auVar58._8_4_ = fVar3;
  auVar58._12_4_ = fVar3;
  auVar58._16_4_ = fVar3;
  auVar58._20_4_ = fVar3;
  auVar58._24_4_ = fVar3;
  auVar58._28_4_ = fVar3;
  auVar59 = ZEXT3264(auVar58);
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar61._4_4_ = fVar4;
  auVar61._0_4_ = fVar4;
  auVar61._8_4_ = fVar4;
  auVar61._12_4_ = fVar4;
  auVar61._16_4_ = fVar4;
  auVar61._20_4_ = fVar4;
  auVar61._24_4_ = fVar4;
  auVar61._28_4_ = fVar4;
  auVar62 = ZEXT3264(auVar61);
  fVar5 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar64 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,CONCAT412(fVar5
                                                  ,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))))))));
  auVar41._4_4_ = fVar5 * auVar53._4_4_;
  auVar41._0_4_ = fVar5 * auVar53._0_4_;
  auVar41._8_4_ = fVar5 * auVar53._8_4_;
  auVar41._12_4_ = fVar5 * auVar53._12_4_;
  auVar41._16_4_ = fVar5 * auVar53._16_4_;
  auVar41._20_4_ = fVar5 * auVar53._20_4_;
  auVar41._24_4_ = fVar5 * auVar53._24_4_;
  auVar41._28_4_ = uVar1;
  auVar68 = vfmadd231ps_fma(auVar41,auVar38,auVar61);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar34,auVar58);
  auVar44._0_4_ = fVar18 * auVar68._0_4_;
  auVar44._4_4_ = fVar18 * auVar68._4_4_;
  auVar44._8_4_ = fVar18 * auVar68._8_4_;
  auVar44._12_4_ = fVar18 * auVar68._12_4_;
  auVar44._16_4_ = fVar18 * 0.0;
  auVar44._20_4_ = fVar18 * 0.0;
  auVar44._24_4_ = fVar18 * 0.0;
  auVar44._28_4_ = 0;
  auVar21._4_4_ = fVar3 * auVar44._4_4_;
  auVar21._0_4_ = fVar3 * auVar44._0_4_;
  auVar21._8_4_ = fVar3 * auVar44._8_4_;
  auVar21._12_4_ = fVar3 * auVar44._12_4_;
  auVar21._16_4_ = fVar3 * auVar44._16_4_;
  auVar21._20_4_ = fVar3 * auVar44._20_4_;
  auVar21._24_4_ = fVar3 * auVar44._24_4_;
  auVar21._28_4_ = uVar2;
  auVar55._0_4_ = fVar4 * auVar44._0_4_;
  auVar55._4_4_ = fVar4 * auVar44._4_4_;
  auVar55._8_4_ = fVar4 * auVar44._8_4_;
  auVar55._12_4_ = fVar4 * auVar44._12_4_;
  auVar55._16_4_ = fVar4 * auVar44._16_4_;
  auVar55._20_4_ = fVar4 * auVar44._20_4_;
  auVar55._28_36_ = in_ZMM8._28_36_;
  auVar55._24_4_ = fVar4 * auVar44._24_4_;
  auVar56._0_4_ = fVar5 * auVar44._0_4_;
  auVar56._4_4_ = fVar5 * auVar44._4_4_;
  auVar56._8_4_ = fVar5 * auVar44._8_4_;
  auVar56._12_4_ = fVar5 * auVar44._12_4_;
  auVar56._16_4_ = fVar5 * auVar44._16_4_;
  auVar56._20_4_ = fVar5 * auVar44._20_4_;
  auVar56._28_36_ = in_ZMM9._28_36_;
  auVar56._24_4_ = fVar5 * auVar44._24_4_;
  auVar41 = vsubps_avx(auVar34,auVar21);
  auVar65 = ZEXT3264(auVar41);
  auVar21 = vsubps_avx(auVar38,auVar55._0_32_);
  auVar55 = ZEXT3264(auVar21);
  auVar53 = vsubps_avx(auVar53,auVar56._0_32_);
  auVar56 = ZEXT3264(auVar53);
  auVar34._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar34._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar34._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar34._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar34._16_4_ = auVar53._16_4_ * auVar53._16_4_;
  auVar34._20_4_ = auVar53._20_4_ * auVar53._20_4_;
  auVar34._24_4_ = auVar53._24_4_ * auVar53._24_4_;
  auVar34._28_4_ = auVar38._28_4_;
  auVar68 = vfmadd231ps_fma(auVar34,auVar21,auVar21);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar41,auVar41);
  auVar22._4_4_ = auVar36._4_4_ * auVar36._4_4_;
  auVar22._0_4_ = auVar36._0_4_ * auVar36._0_4_;
  auVar22._8_4_ = auVar36._8_4_ * auVar36._8_4_;
  auVar22._12_4_ = auVar36._12_4_ * auVar36._12_4_;
  auVar22._16_4_ = auVar36._16_4_ * auVar36._16_4_;
  auVar22._20_4_ = auVar36._20_4_ * auVar36._20_4_;
  auVar22._24_4_ = auVar36._24_4_ * auVar36._24_4_;
  auVar22._28_4_ = auVar36._28_4_;
  auVar34 = vcmpps_avx(ZEXT1632(auVar68),auVar22,2);
  auVar38 = auVar31 & auVar34;
  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar38 >> 0x7f,0) != '\0') ||
        (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar38 >> 0xbf,0) != '\0') ||
      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar38[0x1f] < '\0') {
    auVar34 = vandps_avx(auVar34,auVar31);
    auVar20 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
    auVar34 = vsubps_avx(auVar22,ZEXT1632(auVar68));
    auVar23._4_4_ = fVar18 * auVar34._4_4_;
    auVar23._0_4_ = fVar18 * auVar34._0_4_;
    auVar23._8_4_ = fVar18 * auVar34._8_4_;
    auVar23._12_4_ = fVar18 * auVar34._12_4_;
    auVar23._16_4_ = fVar18 * auVar34._16_4_;
    auVar23._20_4_ = fVar18 * auVar34._20_4_;
    auVar23._24_4_ = fVar18 * auVar34._24_4_;
    auVar23._28_4_ = auVar34._28_4_;
    auVar36 = vsqrtps_avx(auVar23);
    auVar67 = ZEXT3264(auVar36);
    auVar31 = vsubps_avx(auVar44,auVar36);
    auVar50._0_4_ = auVar36._0_4_ + auVar44._0_4_;
    auVar50._4_4_ = auVar36._4_4_ + auVar44._4_4_;
    auVar50._8_4_ = auVar36._8_4_ + auVar44._8_4_;
    auVar50._12_4_ = auVar36._12_4_ + auVar44._12_4_;
    auVar50._16_4_ = auVar36._16_4_ + auVar44._16_4_;
    auVar50._20_4_ = auVar36._20_4_ + auVar44._20_4_;
    auVar50._24_4_ = auVar36._24_4_ + auVar44._24_4_;
    auVar50._28_4_ = auVar36._28_4_ + 0.0;
    auVar51 = ZEXT3264(auVar50);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar40._4_4_ = uVar1;
    auVar40._0_4_ = uVar1;
    auVar40._8_4_ = uVar1;
    auVar40._12_4_ = uVar1;
    auVar40._16_4_ = uVar1;
    auVar40._20_4_ = uVar1;
    auVar40._24_4_ = uVar1;
    auVar40._28_4_ = uVar1;
    auVar34 = vcmpps_avx(auVar40,auVar31,2);
    fVar18 = (ray->super_RayK<1>).tfar;
    auVar46._4_4_ = fVar18;
    auVar46._0_4_ = fVar18;
    auVar46._8_4_ = fVar18;
    auVar46._12_4_ = fVar18;
    auVar46._16_4_ = fVar18;
    auVar46._20_4_ = fVar18;
    auVar46._24_4_ = fVar18;
    auVar46._28_4_ = fVar18;
    auVar38 = vcmpps_avx(auVar31,auVar46,2);
    auVar34 = vandps_avx(auVar34,auVar38);
    auVar68 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
    auVar19 = vpand_avx(auVar68,auVar20);
    auVar48 = ZEXT1664(auVar19);
    auVar34 = vcmpps_avx(auVar40,auVar50,2);
    auVar38 = vcmpps_avx(auVar50,auVar46,2);
    auVar34 = vandps_avx(auVar34,auVar38);
    auVar68 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
    auVar68 = vpand_avx(auVar68,auVar20);
    auVar69 = ZEXT1664(auVar68);
    auVar68 = vpor_avx(auVar68,auVar19);
    auVar34 = vpmovsxwd_avx2(auVar68);
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0x7f,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar34 >> 0xbf,0) != '\0') ||
        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar34[0x1f] < '\0')
    {
      auVar22 = vpmovsxwd_avx2(auVar19);
      local_220 = vblendvps_avx(auVar50,auVar31,auVar22);
      auVar37._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
      auVar37._8_4_ = -auVar36._8_4_;
      auVar37._12_4_ = -auVar36._12_4_;
      auVar37._16_4_ = -auVar36._16_4_;
      auVar37._20_4_ = -auVar36._20_4_;
      auVar37._24_4_ = -auVar36._24_4_;
      auVar37._28_4_ = -auVar36._28_4_;
      auVar38 = vblendvps_avx(auVar36,auVar37,auVar22);
      fVar18 = auVar38._0_4_;
      fVar12 = auVar38._4_4_;
      auVar24._4_4_ = fVar3 * fVar12;
      auVar24._0_4_ = fVar3 * fVar18;
      fVar13 = auVar38._8_4_;
      auVar24._8_4_ = fVar3 * fVar13;
      fVar14 = auVar38._12_4_;
      auVar24._12_4_ = fVar3 * fVar14;
      fVar15 = auVar38._16_4_;
      auVar24._16_4_ = fVar3 * fVar15;
      fVar16 = auVar38._20_4_;
      auVar24._20_4_ = fVar3 * fVar16;
      fVar17 = auVar38._24_4_;
      auVar24._24_4_ = fVar3 * fVar17;
      auVar24._28_4_ = 0x80000000;
      auVar25._4_4_ = fVar4 * fVar12;
      auVar25._0_4_ = fVar4 * fVar18;
      auVar25._8_4_ = fVar4 * fVar13;
      auVar25._12_4_ = fVar4 * fVar14;
      auVar25._16_4_ = fVar4 * fVar15;
      auVar25._20_4_ = fVar4 * fVar16;
      auVar25._24_4_ = fVar4 * fVar17;
      auVar25._28_4_ = auVar22._28_4_;
      auVar26._4_4_ = fVar5 * fVar12;
      auVar26._0_4_ = fVar5 * fVar18;
      auVar26._8_4_ = fVar5 * fVar13;
      auVar26._12_4_ = fVar5 * fVar14;
      auVar26._16_4_ = fVar5 * fVar15;
      auVar26._20_4_ = fVar5 * fVar16;
      auVar26._24_4_ = fVar5 * fVar17;
      auVar26._28_4_ = auVar38._28_4_;
      local_200 = vsubps_avx(auVar24,auVar41);
      local_1e0 = vsubps_avx(auVar25,auVar21);
      local_1c0 = vsubps_avx(auVar26,auVar53);
      auVar47 = ZEXT3264(local_220);
      local_280 = auVar34;
      auVar38 = vpmovzxwd_avx2(auVar68);
      auVar38 = vpslld_avx2(auVar38,0x1f);
      auVar53._8_4_ = 0x7f800000;
      auVar53._0_8_ = 0x7f8000007f800000;
      auVar53._12_4_ = 0x7f800000;
      auVar53._16_4_ = 0x7f800000;
      auVar53._20_4_ = 0x7f800000;
      auVar53._24_4_ = 0x7f800000;
      auVar53._28_4_ = 0x7f800000;
      auVar54 = ZEXT3264(auVar53);
      auVar38 = vblendvps_avx(auVar53,local_220,auVar38);
      auVar53 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar53 = vminps_avx(auVar38,auVar53);
      auVar41 = vshufpd_avx(auVar53,auVar53,5);
      auVar53 = vminps_avx(auVar53,auVar41);
      auVar41 = vpermpd_avx2(auVar53,0x4e);
      auVar53 = vminps_avx(auVar53,auVar41);
      auVar38 = vcmpps_avx(auVar38,auVar53,0);
      auVar53 = auVar34 & auVar38;
      if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0x7f,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar53 >> 0xbf,0) != '\0') ||
          (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar53[0x1f] < '\0') {
        auVar34 = vandps_avx(auVar38,auVar34);
      }
      uVar27 = vmovmskps_avx(auVar34);
      uVar28 = 0;
      for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
        uVar28 = uVar28 + 1;
      }
LAB_017f1bb5:
      auVar38 = auVar56._0_32_;
      auVar34 = auVar55._0_32_;
      auVar53 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar60 = auVar62._0_28_;
      auVar66 = auVar67._0_28_;
      auVar57 = auVar59._0_28_;
      auVar45 = ZEXT436(auVar41._28_4_);
      auVar68 = auVar69._0_16_;
      uVar30 = (ulong)uVar28;
      local_298 = local_80[uVar30];
      pGVar8 = (pSVar29->geometries).items[local_298].ptr;
      if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
        *(undefined4 *)(local_280 + uVar30 * 4) = 0;
        auVar45 = ZEXT436(auVar41._28_4_);
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar30 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_200 + uVar30 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_1e0 + uVar30 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_1c0 + uVar30 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[uVar30];
          ray->geomID = local_298;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
LAB_017f1fa8:
          fVar3 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar3;
          auVar33._0_4_ = fVar3;
          auVar33._8_4_ = fVar3;
          auVar33._12_4_ = fVar3;
          auVar33._16_4_ = fVar3;
          auVar33._20_4_ = fVar3;
          auVar33._24_4_ = fVar3;
          auVar33._28_4_ = fVar3;
          auVar20 = vpand_avx(auVar68,auVar48._0_16_);
          local_220 = auVar51._0_32_;
          auVar41 = vcmpps_avx(local_220,auVar33,2);
          auVar68 = vpackssdw_avx(auVar41._0_16_,auVar41._16_16_);
          auVar68 = vpand_avx(auVar68,auVar20);
          auVar41 = vpmovzxwd_avx2(auVar68);
          auVar41 = vpslld_avx2(auVar41,0x1f);
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar41 >> 0x7f,0) == '\0') &&
                (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar41 >> 0xbf,0) == '\0') &&
              (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar41[0x1f]) {
            return;
          }
          local_280 = vpsrad_avx2(auVar41,0x1f);
          fVar3 = auVar66._0_4_;
          auVar59._0_4_ = auVar57._0_4_ * fVar3;
          fVar4 = auVar66._4_4_;
          auVar59._4_4_ = auVar57._4_4_ * fVar4;
          fVar5 = auVar66._8_4_;
          auVar59._8_4_ = auVar57._8_4_ * fVar5;
          fVar18 = auVar66._12_4_;
          auVar59._12_4_ = auVar57._12_4_ * fVar18;
          fVar12 = auVar66._16_4_;
          auVar59._16_4_ = auVar57._16_4_ * fVar12;
          fVar13 = auVar66._20_4_;
          auVar59._20_4_ = auVar57._20_4_ * fVar13;
          fVar14 = auVar66._24_4_;
          auVar59._24_4_ = auVar57._24_4_ * fVar14;
          auVar59._28_36_ = auVar45;
          auVar62._0_4_ = auVar60._0_4_ * fVar3;
          auVar62._4_4_ = auVar60._4_4_ * fVar4;
          auVar62._8_4_ = auVar60._8_4_ * fVar5;
          auVar62._12_4_ = auVar60._12_4_ * fVar18;
          auVar62._16_4_ = auVar60._16_4_ * fVar12;
          auVar62._20_4_ = auVar60._20_4_ * fVar13;
          auVar62._28_36_ = auVar47._28_36_;
          auVar62._24_4_ = auVar60._24_4_ * fVar14;
          auVar64._0_4_ = auVar63._0_4_ * fVar3;
          auVar64._4_4_ = auVar63._4_4_ * fVar4;
          auVar64._8_4_ = auVar63._8_4_ * fVar5;
          auVar64._12_4_ = auVar63._12_4_ * fVar18;
          auVar64._16_4_ = auVar63._16_4_ * fVar12;
          auVar64._20_4_ = auVar63._20_4_ * fVar13;
          auVar64._28_36_ = auVar48._28_36_;
          auVar64._24_4_ = auVar63._24_4_ * fVar14;
          local_200 = vsubps_avx(auVar59._0_32_,auVar53);
          local_1e0 = vsubps_avx(auVar62._0_32_,auVar34);
          local_1c0 = vsubps_avx(auVar64._0_32_,auVar38);
          pSVar29 = context->scene;
          auVar34 = vblendvps_avx(auVar54._0_32_,local_220,auVar41);
          auVar38 = vshufps_avx(auVar34,auVar34,0xb1);
          auVar38 = vminps_avx(auVar34,auVar38);
          auVar53 = vshufpd_avx(auVar38,auVar38,5);
          auVar38 = vminps_avx(auVar38,auVar53);
          auVar53 = vpermpd_avx2(auVar38,0x4e);
          auVar38 = vminps_avx(auVar38,auVar53);
          auVar34 = vcmpps_avx(auVar34,auVar38,0);
          auVar20 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
          auVar68 = vpand_avx(auVar20,auVar68);
          auVar34 = vpmovzxwd_avx2(auVar68);
          auVar34 = vpslld_avx2(auVar34,0x1f);
          if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar34 >> 0x7f,0) == '\0') &&
                (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar34 >> 0xbf,0) == '\0') &&
              (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar34[0x1f]) {
            auVar34 = local_280;
          }
          uVar27 = vmovmskps_avx(auVar34);
          uVar28 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
            uVar28 = uVar28 + 1;
          }
          do {
            uVar30 = (ulong)uVar28;
            local_298 = local_80[uVar30];
            pGVar8 = (pSVar29->geometries).items[local_298].ptr;
            if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
              *(undefined4 *)(local_280 + uVar30 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar30 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_200 + uVar30 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_1e0 + uVar30 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_1c0 + uVar30 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[uVar30];
                ray->geomID = local_298;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_2b0 = *(float *)(local_200 + uVar30 * 4);
              local_2ac = *(undefined4 *)(local_1e0 + uVar30 * 4);
              local_2a8 = *(undefined4 *)(local_1c0 + uVar30 * 4);
              local_2a4 = 0;
              local_29c = (sphere->primIDs).field_0.i[uVar30];
              local_294 = context->user->instID[0];
              local_290 = context->user->instPrimID[0];
              local_160._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar30 * 4);
              local_2ec = -1;
              local_2e8.valid = &local_2ec;
              local_2e8.geometryUserPtr = pGVar8->userPtr;
              local_2e8.context = context->user;
              local_2e8.ray = (RTCRayN *)ray;
              local_2e8.hit = (RTCHitN *)&local_2b0;
              local_2e8.N = 1;
              local_240 = auVar51._0_32_;
              if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017f21bb:
                p_Var11 = context->args->filter;
                if (p_Var11 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var11)(&local_2e8);
                    auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar51 = ZEXT3264(local_240);
                  }
                  if (*local_2e8.valid == 0) goto LAB_017f22c5;
                }
                (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_2e8.hit;
                (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_2e8.hit + 4);
                (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_2e8.hit + 8);
                *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc);
                *(float *)((long)local_2e8.ray + 0x40) = *(float *)(local_2e8.hit + 0x10);
                *(float *)((long)local_2e8.ray + 0x44) = *(float *)(local_2e8.hit + 0x14);
                *(float *)((long)local_2e8.ray + 0x48) = *(float *)(local_2e8.hit + 0x18);
                *(float *)((long)local_2e8.ray + 0x4c) = *(float *)(local_2e8.hit + 0x1c);
                *(float *)((long)local_2e8.ray + 0x50) = *(float *)(local_2e8.hit + 0x20);
              }
              else {
                local_180._0_8_ = pSVar29;
                (*pGVar8->intersectionFilterN)(&local_2e8);
                auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar51 = ZEXT3264(local_240);
                pSVar29 = (Scene *)local_180._0_8_;
                if (*local_2e8.valid != 0) goto LAB_017f21bb;
LAB_017f22c5:
                (ray->super_RayK<1>).tfar = (float)local_160._0_4_;
              }
              *(undefined4 *)(local_280 + uVar30 * 4) = 0;
              fVar3 = (ray->super_RayK<1>).tfar;
              auVar35._4_4_ = fVar3;
              auVar35._0_4_ = fVar3;
              auVar35._8_4_ = fVar3;
              auVar35._12_4_ = fVar3;
              auVar35._16_4_ = fVar3;
              auVar35._20_4_ = fVar3;
              auVar35._24_4_ = fVar3;
              auVar35._28_4_ = fVar3;
              auVar34 = vcmpps_avx(auVar51._0_32_,auVar35,2);
              local_280 = vandps_avx(auVar34,local_280);
            }
            if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_280 >> 0x7f,0) == '\0') &&
                  (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_280 >> 0xbf,0) == '\0') &&
                (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_280[0x1f]) {
              return;
            }
            auVar34 = vblendvps_avx(auVar54._0_32_,auVar51._0_32_,local_280);
            auVar38 = vshufps_avx(auVar34,auVar34,0xb1);
            auVar38 = vminps_avx(auVar34,auVar38);
            auVar53 = vshufpd_avx(auVar38,auVar38,5);
            auVar38 = vminps_avx(auVar38,auVar53);
            auVar53 = vpermpd_avx2(auVar38,0x4e);
            auVar38 = vminps_avx(auVar38,auVar53);
            auVar38 = vcmpps_avx(auVar34,auVar38,0);
            auVar53 = local_280 & auVar38;
            auVar34 = local_280;
            if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar53 >> 0x7f,0) != '\0') ||
                  (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar53 >> 0xbf,0) != '\0') ||
                (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar53[0x1f] < '\0') {
              auVar34 = vandps_avx(auVar38,local_280);
            }
            uVar27 = vmovmskps_avx(auVar34);
            uVar28 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
              uVar28 = uVar28 + 1;
            }
          } while( true );
        }
        auVar45 = (undefined1  [36])0x0;
        local_2b0 = *(float *)(local_200 + uVar30 * 4);
        local_2ac = *(undefined4 *)(local_1e0 + uVar30 * 4);
        local_2a8 = *(undefined4 *)(local_1c0 + uVar30 * 4);
        local_2a4 = 0;
        local_29c = (sphere->primIDs).field_0.i[uVar30];
        local_294 = context->user->instID[0];
        local_290 = context->user->instPrimID[0];
        local_2b4 = (ray->super_RayK<1>).tfar;
        (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar30 * 4);
        local_2ec = -1;
        local_2e8.valid = &local_2ec;
        local_2e8.geometryUserPtr = pGVar8->userPtr;
        local_2e8.context = context->user;
        local_2e8.ray = (RTCRayN *)ray;
        local_2e8.hit = (RTCHitN *)&local_2b0;
        local_2e8.N = 1;
        local_240 = auVar51._0_32_;
        local_160 = auVar59._0_32_;
        local_180 = auVar62._0_32_;
        local_a0 = auVar64._0_32_;
        local_c0 = auVar53;
        local_e0 = auVar34;
        local_100 = auVar38;
        local_120 = auVar67._0_32_;
        local_190 = auVar48._0_16_;
        local_1a0 = auVar68;
        local_140 = auVar47._0_32_;
        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017f1da1:
          p_Var11 = context->args->filter;
          if (p_Var11 != (RTCFilterFunctionN)0x0) {
            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
              auVar45 = (undefined1  [36])0x0;
              (*p_Var11)(&local_2e8);
              auVar47 = ZEXT3264(local_140);
              auVar69 = ZEXT1664(local_1a0);
              auVar48 = ZEXT1664(local_190);
              auVar67 = ZEXT3264(local_120);
              auVar56 = ZEXT3264(local_100);
              auVar55 = ZEXT3264(local_e0);
              auVar65 = ZEXT3264(local_c0);
              auVar64 = ZEXT3264(local_a0);
              auVar62 = ZEXT3264(local_180);
              auVar59 = ZEXT3264(local_160);
              auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar51 = ZEXT3264(local_240);
            }
            if (*local_2e8.valid == 0) goto LAB_017f1f0d;
          }
          (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.x = *(float *)local_2e8.hit;
          (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_2e8.hit + 4);
          (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_2e8.hit + 8);
          *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc);
          *(float *)((long)local_2e8.ray + 0x40) = *(float *)(local_2e8.hit + 0x10);
          *(float *)((long)local_2e8.ray + 0x44) = *(float *)(local_2e8.hit + 0x14);
          *(float *)((long)local_2e8.ray + 0x48) = *(float *)(local_2e8.hit + 0x18);
          *(float *)((long)local_2e8.ray + 0x4c) = *(float *)(local_2e8.hit + 0x1c);
          *(float *)((long)local_2e8.ray + 0x50) = *(float *)(local_2e8.hit + 0x20);
        }
        else {
          auVar45 = (undefined1  [36])0x0;
          local_248 = pSVar29;
          (*pGVar8->intersectionFilterN)(&local_2e8);
          auVar47 = ZEXT3264(local_140);
          auVar69 = ZEXT1664(local_1a0);
          auVar48 = ZEXT1664(local_190);
          auVar67 = ZEXT3264(local_120);
          auVar56 = ZEXT3264(local_100);
          auVar55 = ZEXT3264(local_e0);
          auVar65 = ZEXT3264(local_c0);
          auVar64 = ZEXT3264(local_a0);
          auVar62 = ZEXT3264(local_180);
          auVar59 = ZEXT3264(local_160);
          auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          auVar51 = ZEXT3264(local_240);
          pSVar29 = local_248;
          if (*local_2e8.valid != 0) goto LAB_017f1da1;
LAB_017f1f0d:
          (ray->super_RayK<1>).tfar = local_2b4;
        }
        *(undefined4 *)(local_280 + uVar30 * 4) = 0;
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar32._4_4_ = fVar3;
        auVar32._0_4_ = fVar3;
        auVar32._8_4_ = fVar3;
        auVar32._12_4_ = fVar3;
        auVar32._16_4_ = fVar3;
        auVar32._20_4_ = fVar3;
        auVar32._24_4_ = fVar3;
        auVar32._28_4_ = fVar3;
        auVar34 = vcmpps_avx(auVar47._0_32_,auVar32,2);
        local_280 = vandps_avx(auVar34,local_280);
      }
      auVar38 = auVar56._0_32_;
      auVar34 = auVar55._0_32_;
      auVar53 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar60 = auVar62._0_28_;
      auVar66 = auVar67._0_28_;
      auVar57 = auVar59._0_28_;
      auVar68 = auVar69._0_16_;
      if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_280 >> 0x7f,0) == '\0') &&
            (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_280 >> 0xbf,0) == '\0') &&
          (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_280[0x1f]) goto LAB_017f1fa8;
      auVar34 = vblendvps_avx(auVar54._0_32_,auVar47._0_32_,local_280);
      auVar38 = vshufps_avx(auVar34,auVar34,0xb1);
      auVar38 = vminps_avx(auVar34,auVar38);
      auVar53 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar53);
      auVar41 = vpermpd_avx2(auVar38,0x4e);
      auVar38 = vminps_avx(auVar38,auVar41);
      auVar38 = vcmpps_avx(auVar34,auVar38,0);
      auVar53 = local_280 & auVar38;
      auVar34 = local_280;
      if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0x7f,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar53 >> 0xbf,0) != '\0') ||
          (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar53[0x1f] < '\0') {
        auVar34 = vandps_avx(auVar38,local_280);
      }
      uVar27 = vmovmskps_avx(auVar34);
      uVar28 = 0;
      for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
        uVar28 = uVar28 + 1;
      }
      goto LAB_017f1bb5;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }